

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
write_padded<duckdb_fmt::v6::internal::nonfinite_writer<wchar_t>>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          nonfinite_writer<wchar_t> *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  wchar_t __tmp;
  char *pcVar8;
  size_t size;
  int *piVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  buffer<wchar_t> *c;
  int iVar21;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  uVar13 = (ulong)(uint)specs->width;
  uVar15 = 4 - (ulong)(f->sign == none);
  puVar2 = *(undefined8 **)this;
  lVar12 = puVar2[2];
  uVar10 = uVar13 - uVar15;
  if (uVar13 < uVar15 || uVar10 == 0) {
    uVar15 = uVar15 + lVar12;
    if ((ulong)puVar2[3] < uVar15) {
      (**(code **)*puVar2)(puVar2,uVar15);
    }
    puVar2[2] = uVar15;
    piVar9 = (int *)(lVar12 * 4 + puVar2[1]);
    if ((ulong)f->sign != 0) {
      *piVar9 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      piVar9 = piVar9 + 1;
    }
    pcVar8 = f->str;
    uVar10 = 4;
    lVar12 = 0;
    do {
      piVar9[lVar12] = (int)pcVar8[lVar12];
      uVar10 = uVar10 - 1;
      lVar12 = lVar12 + 1;
    } while (1 < uVar10);
  }
  else {
    uVar14 = lVar12 + uVar13;
    if ((ulong)puVar2[3] < uVar14) {
      (**(code **)*puVar2)(puVar2,uVar14);
    }
    puVar2[2] = uVar14;
    auVar6 = _DAT_0135a330;
    auVar5 = _DAT_0135a310;
    auVar4 = _DAT_01352200;
    lVar3 = puVar2[1];
    piVar9 = (int *)(lVar3 + lVar12 * 4);
    wVar1 = (specs->fill).data_[0];
    bVar11 = specs->field_0x9 & 0xf;
    if (bVar11 == 3) {
      uVar14 = uVar10 >> 1;
      if (1 < uVar10) {
        piVar9 = piVar9 + uVar14;
        uVar10 = uVar14 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar26._8_4_ = (int)uVar10;
        auVar26._0_8_ = uVar10;
        auVar26._12_4_ = (int)(uVar10 >> 0x20);
        lVar3 = lVar3 + lVar12 * 4;
        lVar12 = 0;
        auVar26 = auVar26 ^ _DAT_01352200;
        do {
          auVar23._8_4_ = (int)lVar12;
          auVar23._0_8_ = lVar12;
          auVar23._12_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar27 = (auVar23 | auVar5) ^ auVar4;
          iVar21 = auVar26._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar21 && auVar26._0_4_ < auVar27._0_4_ ||
                      iVar21 < auVar27._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar12 * 4) = wVar1;
          }
          if ((auVar27._12_4_ != auVar26._12_4_ || auVar27._8_4_ <= auVar26._8_4_) &&
              auVar27._12_4_ <= auVar26._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar12 * 4) = wVar1;
          }
          auVar23 = (auVar23 | auVar6) ^ auVar4;
          iVar28 = auVar23._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar23._0_4_ <= auVar26._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar12 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar12 * 4) = wVar1;
          }
          lVar12 = lVar12 + 4;
        } while ((uVar10 - ((uint)(uVar14 + 0x3fffffffffffffff) & 3)) + 4 != lVar12);
      }
      if ((ulong)f->sign != 0) {
        *piVar9 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
        piVar9 = piVar9 + 1;
      }
      pcVar8 = f->str;
      uVar10 = 4;
      do {
        piVar7 = piVar9;
        *piVar7 = (int)*pcVar8;
        auVar6 = _DAT_0135a330;
        auVar5 = _DAT_0135a310;
        auVar4 = _DAT_01352200;
        pcVar8 = pcVar8 + 1;
        uVar10 = uVar10 - 1;
        piVar9 = piVar7 + 1;
      } while (1 < uVar10);
      if (uVar13 != uVar15) {
        uVar13 = (uVar13 * 4 + (uVar15 + uVar14) * -4) - 4;
        auVar27._8_4_ = (int)uVar13;
        auVar27._0_8_ = uVar13;
        auVar27._12_4_ = (int)(uVar13 >> 0x20);
        auVar18._0_8_ = uVar13 >> 2;
        auVar18._8_8_ = auVar27._8_8_ >> 2;
        uVar10 = 0;
        auVar18 = auVar18 ^ _DAT_01352200;
        do {
          auVar24._8_4_ = (int)uVar10;
          auVar24._0_8_ = uVar10;
          auVar24._12_4_ = (int)(uVar10 >> 0x20);
          auVar26 = (auVar24 | auVar5) ^ auVar4;
          iVar21 = auVar18._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar21 && auVar18._0_4_ < auVar26._0_4_ ||
                      iVar21 < auVar26._4_4_) & 1)) {
            (piVar7 + 1)[uVar10] = wVar1;
          }
          if ((auVar26._12_4_ != auVar18._12_4_ || auVar26._8_4_ <= auVar18._8_4_) &&
              auVar26._12_4_ <= auVar18._12_4_) {
            piVar7[uVar10 + 2] = wVar1;
          }
          auVar26 = (auVar24 | auVar6) ^ auVar4;
          iVar28 = auVar26._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar18._0_4_)) {
            piVar7[uVar10 + 3] = wVar1;
            piVar7[uVar10 + 4] = wVar1;
          }
          uVar10 = uVar10 + 4;
        } while (((uVar13 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
      }
    }
    else if (bVar11 == 2) {
      if (uVar13 != uVar15) {
        piVar9 = piVar9 + uVar10;
        uVar13 = (uVar13 * 4 + uVar15 * -4) - 4;
        auVar16._8_4_ = (int)uVar13;
        auVar16._0_8_ = uVar13;
        auVar16._12_4_ = (int)(uVar13 >> 0x20);
        auVar17._0_8_ = uVar13 >> 2;
        auVar17._8_8_ = auVar16._8_8_ >> 2;
        lVar3 = lVar3 + lVar12 * 4;
        uVar10 = 0;
        auVar17 = auVar17 ^ _DAT_01352200;
        do {
          auVar22._8_4_ = (int)uVar10;
          auVar22._0_8_ = uVar10;
          auVar22._12_4_ = (int)(uVar10 >> 0x20);
          auVar26 = (auVar22 | auVar5) ^ auVar4;
          iVar21 = auVar17._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar21 && auVar17._0_4_ < auVar26._0_4_ ||
                      iVar21 < auVar26._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + uVar10 * 4) = wVar1;
          }
          if ((auVar26._12_4_ != auVar17._12_4_ || auVar26._8_4_ <= auVar17._8_4_) &&
              auVar26._12_4_ <= auVar17._12_4_) {
            *(wchar_t *)(lVar3 + 4 + uVar10 * 4) = wVar1;
          }
          auVar26 = (auVar22 | auVar6) ^ auVar4;
          iVar28 = auVar26._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar17._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + uVar10 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + uVar10 * 4) = wVar1;
          }
          uVar10 = uVar10 + 4;
        } while (((uVar13 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
      }
      if ((ulong)f->sign != 0) {
        *piVar9 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
        piVar9 = piVar9 + 1;
      }
      pcVar8 = f->str;
      uVar10 = 4;
      lVar12 = 0;
      do {
        piVar9[lVar12] = (int)pcVar8[lVar12];
        uVar10 = uVar10 - 1;
        lVar12 = lVar12 + 1;
      } while (1 < uVar10);
    }
    else {
      if ((ulong)f->sign != 0) {
        *piVar9 = (int)*(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
        piVar9 = piVar9 + 1;
      }
      pcVar8 = f->str;
      uVar10 = 4;
      do {
        piVar7 = piVar9;
        *piVar7 = (int)*pcVar8;
        auVar6 = _DAT_0135a330;
        auVar5 = _DAT_0135a310;
        auVar4 = _DAT_01352200;
        pcVar8 = pcVar8 + 1;
        uVar10 = uVar10 - 1;
        piVar9 = piVar7 + 1;
      } while (1 < uVar10);
      if (uVar13 != uVar15) {
        uVar13 = (uVar13 * 4 + uVar15 * -4) - 4;
        auVar19._8_4_ = (int)uVar13;
        auVar19._0_8_ = uVar13;
        auVar19._12_4_ = (int)(uVar13 >> 0x20);
        auVar20._0_8_ = uVar13 >> 2;
        auVar20._8_8_ = auVar19._8_8_ >> 2;
        uVar10 = 0;
        auVar20 = auVar20 ^ _DAT_01352200;
        do {
          auVar25._8_4_ = (int)uVar10;
          auVar25._0_8_ = uVar10;
          auVar25._12_4_ = (int)(uVar10 >> 0x20);
          auVar26 = (auVar25 | auVar5) ^ auVar4;
          iVar21 = auVar20._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar21 && auVar20._0_4_ < auVar26._0_4_ ||
                      iVar21 < auVar26._4_4_) & 1)) {
            (piVar7 + 1)[uVar10] = wVar1;
          }
          if ((auVar26._12_4_ != auVar20._12_4_ || auVar26._8_4_ <= auVar20._8_4_) &&
              auVar26._12_4_ <= auVar20._12_4_) {
            piVar7[uVar10 + 2] = wVar1;
          }
          auVar26 = (auVar25 | auVar6) ^ auVar4;
          iVar28 = auVar26._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar20._0_4_)) {
            piVar7[uVar10 + 3] = wVar1;
            piVar7[uVar10 + 4] = wVar1;
          }
          uVar10 = uVar10 + 4;
        } while (((uVar13 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
      }
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }